

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find
          (StringPiece *this,StringPiece s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  
  uVar1 = this->length_;
  if (uVar1 == 0 || uVar1 < pos) {
    sVar3 = -(ulong)((uVar1 != 0 || pos != 0) || s.length_ != 0);
  }
  else {
    pcVar2 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (this->ptr_ + pos,this->ptr_ + uVar1,s.ptr_,s.ptr_ + s.length_);
    sVar3 = 0xffffffffffffffff;
    if (pcVar2 != this->ptr_ + this->length_) {
      sVar3 = (long)pcVar2 - (long)this->ptr_;
    }
  }
  return sVar3;
}

Assistant:

StringPiece::size_type StringPiece::find(StringPiece s, size_type pos) const {
  if (length_ <= 0 || pos > static_cast<size_type>(length_)) {
    if (length_ == 0 && pos == 0 && s.length_ == 0) return 0;
    return npos;
  }
  const char *result = std::search(ptr_ + pos, ptr_ + length_,
                                   s.ptr_, s.ptr_ + s.length_);
  return result == ptr_ + length_ ? npos : result - ptr_;
}